

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.cc
# Opt level: O0

void __thiscall
gimage::HighDynamicRangeFusionBase::setContrastWeight
          (HighDynamicRangeFusionBase *this,ImageFloat *wp,ImageFloat *lp,float max_value)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Image<float,_gimage::PixelTraits<float>_> *in_RDX;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  float in_XMM0_Da;
  store_t_conflict sVar4;
  int d;
  float v;
  long i;
  long k;
  float *p;
  float scale;
  int local_40;
  float local_3c;
  long local_38;
  long local_30;
  float *local_28;
  
  iVar1 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RDX);
  local_28 = Image<float,_gimage::PixelTraits<float>_>::getPtr(in_RSI,0,0,0);
  local_30 = 0;
  while( true ) {
    lVar3 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RDX);
    if (lVar3 <= local_30) break;
    local_38 = 0;
    while( true ) {
      lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RDX);
      if (lVar3 <= local_38) break;
      local_3c = 0.0;
      local_40 = 0;
      while( true ) {
        iVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RDX);
        if (iVar2 <= local_40) break;
        sVar4 = Image<float,_gimage::PixelTraits<float>_>::get(in_RDX,local_38,local_30,local_40);
        local_3c = sVar4 + local_3c;
        local_40 = local_40 + 1;
      }
      if (local_3c < 0.0) {
        local_3c = -local_3c;
      }
      *local_28 = ((1.0 / in_XMM0_Da) / (float)iVar1) * local_3c;
      local_38 = local_38 + 1;
      local_28 = local_28 + 1;
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void HighDynamicRangeFusionBase::setContrastWeight(ImageFloat &wp, const ImageFloat &lp,
  float max_value)
{
  float scale=1.0f/max_value/lp.getDepth();

  float *p=wp.getPtr(0, 0, 0);
  for (long k=0; k<lp.getHeight(); k++)
  {
    for (long i=0; i<lp.getWidth(); i++)
    {
      float v=0;
      for (int d=0; d<lp.getDepth(); d++)
      {
        v+=lp.get(i, k, d);
      }

      // use absolute value of laplacian as measure for contrast

      if (v < 0) v=-v;

      *p++ = scale*v;
    }
  }
}